

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O1

double * inform_local_relative_entropy(int *xs,int *ys,size_t n,int b,double *re,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  bool bVar3;
  _Bool _Var4;
  inform_dist *dist;
  inform_dist *dist_00;
  size_t sVar5;
  size_t n_00;
  double dVar6;
  double *local_48;
  
  _Var4 = check_arguments(xs,ys,n,b,err);
  if (_Var4) {
    return (double *)0x0;
  }
  local_48 = re;
  if ((re == (double *)0x0) && (local_48 = (double *)malloc(n * 8), local_48 == (double *)0x0)) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    *err = INFORM_ENOMEM;
    return (double *)0x0;
  }
  n_00 = (size_t)b;
  dist = inform_dist_alloc(n_00);
  if (dist == (inform_dist *)0x0) {
    dist_00 = (inform_dist *)0x0;
  }
  else {
    dist_00 = inform_dist_alloc(n_00);
    if (dist_00 != (inform_dist *)0x0) {
      bVar3 = false;
      goto LAB_0015bcc5;
    }
    inform_dist_free(dist);
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  bVar3 = true;
LAB_0015bcc5:
  if (bVar3) {
    if (re == (double *)0x0) {
      free(local_48);
    }
    return (double *)0x0;
  }
  dist->counts = n;
  dist_00->counts = n;
  if (n != 0) {
    puVar1 = dist->histogram;
    puVar2 = dist_00->histogram;
    sVar5 = 0;
    do {
      puVar1[xs[sVar5]] = puVar1[xs[sVar5]] + 1;
      puVar2[ys[sVar5]] = puVar2[ys[sVar5]] + 1;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  if (b != 0) {
    sVar5 = 0;
    do {
      dVar6 = log2((double)dist->histogram[sVar5] / (double)dist_00->histogram[sVar5]);
      local_48[sVar5] = dVar6;
      sVar5 = sVar5 + 1;
    } while (n_00 != sVar5);
  }
  inform_dist_free(dist);
  inform_dist_free(dist_00);
  return local_48;
}

Assistant:

double *inform_local_relative_entropy(int const *xs, int const *ys, size_t n,
    int b, double *re, inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NULL;

    bool allocate_re = (re == NULL);
    if (allocate_re)
    {
        re = malloc(n * sizeof(double));
        if (re == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err))
    {
        if (allocate_re) free(re);
        return NULL;
    }

    accumulate(xs, ys, n, x, y);

    double p, q;
    for (size_t i = 0; i < (size_t) b; ++i)
    {
        p = x->histogram[i];
        q = y->histogram[i];
        re[i] = log2(p / q);
    }

    free_all(&x, &y);

    return re;
}